

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O3

err_t cmdSigHash(octet *hash,size_t hash_len,char *name,size_t drop,octet *certs,size_t certs_len,
                octet *date)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t buf;
  file_t file;
  size_t sVar3;
  void *state;
  ulong uVar4;
  err_t eVar5;
  
  if (hash_len < 0x21) {
    sVar2 = beltHash_keep();
    buf = blobCreate(sVar2 + 0x1000);
    if (buf == (blob_t)0x0) {
      return 0x6e;
    }
    state = (void *)((long)buf + 0x1000);
    beltHashStart(state);
  }
  else {
    sVar2 = bashHash_keep();
    buf = blobCreate(sVar2 + 0x1000);
    if (buf == (blob_t)0x0) {
      return 0x6e;
    }
    state = (void *)((long)buf + 0x1000);
    bashHashStart(state,hash_len * 4);
  }
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    eVar5 = 0xcb;
  }
  else {
    sVar2 = fileSize(file);
    if (sVar2 == 0xffffffffffffffff) {
      eVar5 = 0xcf;
    }
    else {
      eVar5 = 0x132;
      uVar4 = sVar2 - drop;
      if (drop <= sVar2) {
        for (; uVar4 != 0; uVar4 = uVar4 - sVar2) {
          sVar2 = 0x1000;
          if (uVar4 < 0x1000) {
            sVar2 = uVar4;
          }
          sVar3 = fileRead2(buf,sVar2,file);
          if (sVar3 != sVar2) {
            fileClose(file);
            eVar5 = 0xcf;
            goto LAB_00106892;
          }
          if (hash_len < 0x21) {
            beltHashStepH(buf,sVar2,state);
          }
          else {
            bashHashStepH(buf,sVar2,state);
          }
        }
        bVar1 = fileClose(file);
        if (bVar1 == 0) {
          eVar5 = 0x67;
        }
        else {
          if (hash_len < 0x21) {
            beltHashStepH(certs,certs_len,state);
            beltHashStepH(date,6,state);
            beltHashStepG2(hash,hash_len,state);
          }
          else {
            bashHashStepH(certs,certs_len,state);
            bashHashStepH(date,6,state);
            bashHashStepG(hash,hash_len,state);
          }
          eVar5 = 0;
        }
        goto LAB_00106892;
      }
    }
    fileClose(file);
  }
LAB_00106892:
  blobClose(buf);
  return eVar5;
}

Assistant:

static err_t cmdSigHash(octet hash[], size_t hash_len, const char* name,
	size_t drop, const octet certs[], size_t certs_len, const octet date[6])
{
	const size_t buf_size = 4096;
	err_t code;
	octet* stack;
	octet* buf;
	void* state;
	file_t file;
	size_t size;
	// pre
	ASSERT(hash_len == 24 || hash_len == 32 || hash_len == 48 ||
		hash_len == 64);
	ASSERT(memIsValid(hash, hash_len));
	ASSERT(strIsValid(name));
	// выделить и разметить память
	code = cmdBlobCreate(stack, buf_size +
		(hash_len <= 32 ? beltHash_keep() : bashHash_keep()));
	ERR_CALL_CHECK(code);
	buf = (octet*)stack;
	state = buf + buf_size;
	// начать хэширование
	if (hash_len <= 32)
		beltHashStart(state);
	else
		bashHashStart(state, hash_len * 4);
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить размер файла
	size = fileSize(file);
	if (size == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < drop)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// хэшировать файл
	for (size -= drop; size;)
	{
		size_t count = MIN2(size, buf_size);
		if (fileRead2(buf, count, file) != count)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		if (hash_len <= 32)
			beltHashStepH(stack, count, state);
		else
			bashHashStepH(stack, count, state);
		size -= count;
	}
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать сертификаты и дату
	if (hash_len <= 32)
	{
		beltHashStepH(certs, certs_len, state);
		beltHashStepH(date, 6, state);
		beltHashStepG2(hash, hash_len, state);
	}
	else
	{
		bashHashStepH(certs, certs_len, state);
		bashHashStepH(date, 6, state);
		bashHashStepG(hash, hash_len, state);
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}